

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhCursorPrev(unqlite_kv_cursor *pCursor)

{
  unqlite_kv_io *puVar1;
  int iVar2;
  lhash_kv_cursor *pCur;
  int in_R8D;
  unqlite_kv_engine *puVar3;
  lhpage *plStack_20;
  
  if (((*(int *)&pCursor[1].pStore == 2) && (pCursor[2].pStore != (unqlite_kv_engine *)0x0)) &&
     (puVar1 = pCursor[2].pStore[0xd].pIo, pCursor[2].pStore = (unqlite_kv_engine *)puVar1,
     puVar1 != (unqlite_kv_io *)0x0)) {
    return 0;
  }
  puVar3 = pCursor[4].pStore;
  if (puVar3 != (unqlite_kv_engine *)0x0) {
    do {
      if ((*(int *)&pCursor[1].pStore == 2) &&
         ((unqlite_page *)pCursor[3].pStore != (unqlite_page *)0x0)) {
        (*pCursor->pStore->pIo->xPageUnref)((unqlite_page *)pCursor[3].pStore);
        pCursor[3].pStore = (unqlite_kv_engine *)0x0;
      }
      pCursor[4].pStore = (unqlite_kv_engine *)puVar3[2].pIo;
      iVar2 = lhLoadPage((lhash_kv_engine *)pCursor->pStore,(pgno)puVar3[1].pIo,(lhpage *)0x0,
                         &plStack_20,in_R8D);
      if (iVar2 != 0) {
        return iVar2;
      }
      if (plStack_20->pFirst != (lhcell *)0x0) {
        pCursor[2].pStore = (unqlite_kv_engine *)plStack_20->pFirst;
        *(undefined4 *)&pCursor[1].pStore = 2;
        pCursor[3].pStore = (unqlite_kv_engine *)plStack_20->pRaw;
        return 0;
      }
      (*plStack_20->pHash->pIo->xPageUnref)(plStack_20->pRaw);
      puVar3 = pCursor[4].pStore;
    } while (puVar3 != (unqlite_kv_engine *)0x0);
  }
  *(undefined4 *)&pCursor[1].pStore = 3;
  return -0x1c;
}

Assistant:

static int lhCursorPrev(unqlite_kv_cursor *pCursor)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	int rc;
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Load the cells of the previous page  */
		rc = lhCursorPrevPage(pCur);
		return rc;
	}
	pCell = pCur->pCell;
	pCur->pCell = pCell->pPrev;
	if( pCur->pCell == 0 ){
		/* Load the cells of the previous page  */
		rc = lhCursorPrevPage(pCur);
		return rc;
	}
	return UNQLITE_OK;
}